

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O2

void __thiscall DynamicKReach::construct(DynamicKReach *this)

{
  value_type vVar1;
  pointer ppVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  degree_t dVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  uint uVar6;
  priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
  *this_02;
  uint cur;
  uint local_68;
  allocator_type local_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
  *local_58;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_50 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->index_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_50);
  set_degree(this);
  this_02 = (priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
             *)&this->quedeg_;
  uVar6 = 0;
  while( true ) {
    local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar6;
    dVar3 = Graph::num_vertices(this->graph_);
    if (dVar3 <= uVar6) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->degree_,
                        (ulong)(uint)local_48._M_impl.super__Vector_impl_data._M_start);
    std::
    priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>(this_02,pvVar4,(uint *)&local_48);
    uVar6 = (uint)local_48._M_impl.super__Vector_impl_data._M_start + 1;
  }
  local_60 = &this->degree_;
  local_58 = this_02;
  while (ppVar2 = (this->quedeg_).c.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        ppVar2 != (this->quedeg_).c.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    vVar1 = ppVar2->first;
    local_68 = ppVar2->second;
    std::
    priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
    ::pop((priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
           *)this_02);
    if (vVar1 != 0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (local_60,(ulong)local_68);
      this_00 = local_60;
      if (*pvVar4 != 0) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (local_60,(ulong)local_68);
        if (vVar1 == *pvVar4) {
          dVar3 = Graph::num_vertices(this->graph_);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(ulong)dVar3
                     ,"?13DynamicKReach",&local_61);
          this_01 = local_50;
          pmVar5 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_50,&local_68);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (pmVar5,&local_48);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
          ;
          uVar6 = local_68;
          pmVar5 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at(this_01,&local_68);
          construct_bfs(this,uVar6,pmVar5);
          cover(this,local_68);
          this_02 = local_58;
        }
        else {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             (this_00,(ulong)local_68);
          std::
          priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
          ::emplace<unsigned_int&,unsigned_int&>(this_02,pvVar4,&local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::construct() {
    index_.clear();
    set_degree();
    for (vertex_t i = 0; i < graph_.num_vertices(); ++i){
        quedeg_.emplace(degree_.at(i), i);
    }
    while (!quedeg_.empty()){
        auto deg = quedeg_.top().first;
        auto cur = quedeg_.top().second;
        quedeg_.pop();
        if (deg <= 0 || degree_.at(cur) <= 0) {
            continue;
        }
        if (deg != degree_.at(cur)) {
            quedeg_.emplace(degree_.at(cur), cur);
            continue;
        }
        index_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
        construct_bfs(cur, index_.at(cur));
        cover(cur);
    }
}